

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O3

void deqp::gles31::Functional::anon_unknown_0::generateBufferVariableMatrixCaseBlocks
               (Context *context,TestCaseGroup *targetGroup,GLSLVersion glslVersion,
               _func_void_Context_ptr_SharedPtr_ptr_TestCaseGroup_ptr_bool *blockContentGenerator)

{
  undefined1 uVar1;
  MatrixOrder MVar2;
  Node *pNVar3;
  SharedPtrStateBase *pSVar4;
  Node *pNVar5;
  TestNode *node;
  deInt32 *pdVar6;
  long lVar7;
  SharedPtr parentStructure;
  Layout layout;
  SharedPtr local_a8;
  Node *local_98;
  SharedPtrStateBase *local_90;
  Node *local_88;
  SharedPtrStateBase *local_80;
  Node *local_78;
  SharedPtrStateBase *local_70;
  Node *local_68;
  SharedPtrStateBase *local_60;
  _func_void_Context_ptr_SharedPtr_ptr_TestCaseGroup_ptr_bool *local_58;
  TestNode *local_50;
  _func_int **local_44 [2];
  MatrixOrder local_34;
  
  local_58 = blockContentGenerator;
  local_50 = &targetGroup->super_TestNode;
  pNVar3 = (Node *)operator_new(0x28);
  pNVar3->m_type = TYPE_PROGRAM;
  (pNVar3->m_enclosingNode).m_ptr = (Node *)0x0;
  (pNVar3->m_enclosingNode).m_state = (SharedPtrStateBase *)0x0;
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b250;
  *(undefined1 *)&pNVar3[1]._vptr_Node = 0;
  local_68 = pNVar3;
  pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar4->strongRefCount = 0;
  pSVar4->weakRefCount = 0;
  pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
  pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
  pSVar4->strongRefCount = 1;
  pSVar4->weakRefCount = 1;
  local_60 = pSVar4;
  pNVar5 = (Node *)operator_new(0x28);
  pNVar5->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
  pNVar5->m_type = TYPE_SHADER;
  (pNVar5->m_enclosingNode).m_ptr = pNVar3;
  (pNVar5->m_enclosingNode).m_state = pSVar4;
  LOCK();
  pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar6 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
  *pdVar6 = *pdVar6 + 1;
  UNLOCK();
  pNVar5->_vptr_Node = (_func_int **)&PTR__Node_0216b2f8;
  *(undefined4 *)&pNVar5[1]._vptr_Node = 5;
  *(GLSLVersion *)((long)&pNVar5[1]._vptr_Node + 4) = glslVersion;
  local_78 = pNVar5;
  pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar4->strongRefCount = 0;
  pSVar4->weakRefCount = 0;
  pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
  pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
  pSVar4->strongRefCount = 1;
  pSVar4->weakRefCount = 1;
  local_70 = pSVar4;
  pNVar3 = (Node *)operator_new(0x20);
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
  pNVar3->m_type = TYPE_DEFAULT_BLOCK;
  (pNVar3->m_enclosingNode).m_ptr = pNVar5;
  (pNVar3->m_enclosingNode).m_state = pSVar4;
  LOCK();
  pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar6 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
  *pdVar6 = *pdVar6 + 1;
  UNLOCK();
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b330;
  local_88 = pNVar3;
  pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar4->strongRefCount = 0;
  pSVar4->weakRefCount = 0;
  pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
  pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
  pSVar4->strongRefCount = 1;
  pSVar4->weakRefCount = 1;
  local_80 = pSVar4;
  pNVar5 = (Node *)operator_new(0x28);
  pNVar5->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
  pNVar5->m_type = TYPE_STORAGE_QUALIFIER;
  (pNVar5->m_enclosingNode).m_ptr = pNVar3;
  (pNVar5->m_enclosingNode).m_state = pSVar4;
  LOCK();
  pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar6 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
  *pdVar6 = *pdVar6 + 1;
  UNLOCK();
  pNVar5->_vptr_Node = (_func_int **)&PTR__Node_0216b368;
  *(undefined4 *)&pNVar5[1]._vptr_Node = 4;
  local_98 = pNVar5;
  local_90 = (SharedPtrStateBase *)operator_new(0x20);
  local_90->strongRefCount = 0;
  local_90->weakRefCount = 0;
  local_90->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
  local_90[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
  local_90->strongRefCount = 1;
  local_90->weakRefCount = 1;
  lVar7 = 0x14;
  do {
    local_a8.m_ptr = local_98;
    if (local_90 != (SharedPtrStateBase *)0x0) {
      LOCK();
      local_90->strongRefCount = local_90->strongRefCount + 1;
      UNLOCK();
      LOCK();
      local_90->weakRefCount = local_90->weakRefCount + 1;
      UNLOCK();
    }
    local_a8.m_state = local_90;
    node = (TestNode *)operator_new(0x78);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)node,context->m_testCtx,
               *(char **)((long)&PTR_typeinfo_name_0216bee8 + lVar7 + 4),
               *(char **)((long)&PTR_typeinfo_0216bef0 + lVar7 + 4));
    node->_vptr_TestNode = (_func_int **)&PTR__TestCase_02160970;
    node[1]._vptr_TestNode = (_func_int **)context;
    tcu::TestNode::addChild(local_50,node);
    MVar2 = *(MatrixOrder *)
             ((long)&generateBufferVariableMatrixCaseBlocks::children[0].name + lVar7);
    if (MVar2 != MATRIXORDER_LAST) {
      glu::Layout::Layout((Layout *)local_44,-1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
      local_34 = MVar2;
      pNVar3 = (Node *)operator_new(0x38);
      pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
      pNVar3->m_type = TYPE_LAYOUT_QUALIFIER;
      (pNVar3->m_enclosingNode).m_ptr = local_a8.m_ptr;
      (pNVar3->m_enclosingNode).m_state = local_a8.m_state;
      if (local_a8.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (local_a8.m_state)->strongRefCount = (local_a8.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pdVar6 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
        *pdVar6 = *pdVar6 + 1;
        UNLOCK();
      }
      pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b530;
      pNVar3[1]._vptr_Node = local_44[0];
      *(_func_int ***)&pNVar3[1].m_type = local_44[1];
      *(MatrixOrder *)&pNVar3[1].m_enclosingNode.m_ptr = local_34;
      pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar4->strongRefCount = 0;
      pSVar4->weakRefCount = 0;
      pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
      pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
      pSVar4->strongRefCount = 1;
      pSVar4->weakRefCount = 1;
      if (local_a8.m_state != pSVar4) {
        if (local_a8.m_state != (SharedPtrStateBase *)0x0) {
          LOCK();
          pdVar6 = &(local_a8.m_state)->strongRefCount;
          *pdVar6 = *pdVar6 + -1;
          UNLOCK();
          if (*pdVar6 == 0) {
            local_a8.m_ptr = (Node *)0x0;
            (*(local_a8.m_state)->_vptr_SharedPtrStateBase[2])();
          }
          LOCK();
          pdVar6 = &(local_a8.m_state)->weakRefCount;
          *pdVar6 = *pdVar6 + -1;
          UNLOCK();
          if ((*pdVar6 == 0) && (local_a8.m_state != (SharedPtrStateBase *)0x0)) {
            (*(local_a8.m_state)->_vptr_SharedPtrStateBase[1])();
          }
        }
        LOCK();
        pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pSVar4->weakRefCount = pSVar4->weakRefCount + 1;
        UNLOCK();
        local_a8.m_ptr = pNVar3;
        local_a8.m_state = pSVar4;
      }
      pdVar6 = &pSVar4->strongRefCount;
      LOCK();
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if (*pdVar6 == 0) {
        (*pSVar4->_vptr_SharedPtrStateBase[2])(pSVar4);
      }
      pdVar6 = &pSVar4->weakRefCount;
      LOCK();
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if (*pdVar6 == 0) {
        (*pSVar4->_vptr_SharedPtrStateBase[1])(pSVar4);
      }
    }
    pNVar3 = (Node *)operator_new(0x28);
    uVar1 = (&UNK_0216befc)[lVar7];
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
    pNVar3->m_type = TYPE_INTERFACE_BLOCK;
    (pNVar3->m_enclosingNode).m_ptr = local_a8.m_ptr;
    (pNVar3->m_enclosingNode).m_state = local_a8.m_state;
    if (local_a8.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_a8.m_state)->strongRefCount = (local_a8.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar6 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
      *pdVar6 = *pdVar6 + 1;
      UNLOCK();
    }
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b3a0;
    *(undefined1 *)&pNVar3[1]._vptr_Node = uVar1;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    if (local_a8.m_state != pSVar4) {
      if (local_a8.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar6 = &(local_a8.m_state)->strongRefCount;
        *pdVar6 = *pdVar6 + -1;
        UNLOCK();
        if (*pdVar6 == 0) {
          local_a8.m_ptr = (Node *)0x0;
          (*(local_a8.m_state)->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar6 = &(local_a8.m_state)->weakRefCount;
        *pdVar6 = *pdVar6 + -1;
        UNLOCK();
        if ((*pdVar6 == 0) && (local_a8.m_state != (SharedPtrStateBase *)0x0)) {
          (*(local_a8.m_state)->_vptr_SharedPtrStateBase[1])();
        }
      }
      LOCK();
      pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pSVar4->weakRefCount = pSVar4->weakRefCount + 1;
      UNLOCK();
      local_a8.m_ptr = pNVar3;
      local_a8.m_state = pSVar4;
    }
    pdVar6 = &pSVar4->strongRefCount;
    LOCK();
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if (*pdVar6 == 0) {
      (*pSVar4->_vptr_SharedPtrStateBase[2])(pSVar4);
    }
    pdVar6 = &pSVar4->weakRefCount;
    LOCK();
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if (*pdVar6 == 0) {
      (*pSVar4->_vptr_SharedPtrStateBase[1])(pSVar4);
    }
    (*local_58)(context,&local_a8,(TestCaseGroup *)node,(bool)(&UNK_0216befd)[lVar7]);
    if (local_a8.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar6 = &(local_a8.m_state)->strongRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if (*pdVar6 == 0) {
        local_a8.m_ptr = (Node *)0x0;
        (*(local_a8.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar6 = &(local_a8.m_state)->weakRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if ((*pdVar6 == 0) && (local_a8.m_state != (SharedPtrStateBase *)0x0)) {
        (*(local_a8.m_state)->_vptr_SharedPtrStateBase[1])();
      }
    }
    pSVar4 = local_90;
    lVar7 = lVar7 + 0x18;
  } while (lVar7 != 0xa4);
  if (local_90 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar6 = &local_90->strongRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if (*pdVar6 == 0) {
      local_98 = (Node *)0x0;
      (*local_90->_vptr_SharedPtrStateBase[2])(local_90);
    }
    LOCK();
    pdVar6 = &pSVar4->weakRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if ((*pdVar6 == 0) && (local_90 != (SharedPtrStateBase *)0x0)) {
      (*local_90->_vptr_SharedPtrStateBase[1])();
    }
  }
  pSVar4 = local_80;
  if (local_80 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar6 = &local_80->strongRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if (*pdVar6 == 0) {
      local_88 = (Node *)0x0;
      (*local_80->_vptr_SharedPtrStateBase[2])(local_80);
    }
    LOCK();
    pdVar6 = &pSVar4->weakRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if ((*pdVar6 == 0) && (local_80 != (SharedPtrStateBase *)0x0)) {
      (*local_80->_vptr_SharedPtrStateBase[1])();
    }
  }
  pSVar4 = local_70;
  if (local_70 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar6 = &local_70->strongRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if (*pdVar6 == 0) {
      local_78 = (Node *)0x0;
      (*local_70->_vptr_SharedPtrStateBase[2])(local_70);
    }
    LOCK();
    pdVar6 = &pSVar4->weakRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if ((*pdVar6 == 0) && (local_70 != (SharedPtrStateBase *)0x0)) {
      (*local_70->_vptr_SharedPtrStateBase[1])();
    }
  }
  pSVar4 = local_60;
  if (local_60 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar6 = &local_60->strongRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if (*pdVar6 == 0) {
      local_68 = (Node *)0x0;
      (*local_60->_vptr_SharedPtrStateBase[2])(local_60);
    }
    LOCK();
    pdVar6 = &pSVar4->weakRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if ((*pdVar6 == 0) && (local_60 != (SharedPtrStateBase *)0x0)) {
      (*local_60->_vptr_SharedPtrStateBase[1])();
    }
  }
  return;
}

Assistant:

static void generateBufferVariableMatrixCaseBlocks (Context& context, tcu::TestCaseGroup* const targetGroup, glu::GLSLVersion glslVersion, void (*blockContentGenerator)(Context&, const ResourceDefinition::Node::SharedPtr&, tcu::TestCaseGroup*, bool))
{
	static const struct
	{
		const char*			name;
		const char*			description;
		bool				namedBlock;
		bool				extendedBasicTypeCases;
		glu::MatrixOrder	order;
	} children[] =
	{
		{ "named_block",				"Named uniform block",		true,	true,	glu::MATRIXORDER_LAST			},
		{ "named_block_row_major",		"Named uniform block",		true,	false,	glu::MATRIXORDER_ROW_MAJOR		},
		{ "named_block_col_major",		"Named uniform block",		true,	false,	glu::MATRIXORDER_COLUMN_MAJOR	},
		{ "unnamed_block",				"Unnamed uniform block",	false,	false,	glu::MATRIXORDER_LAST			},
		{ "unnamed_block_row_major",	"Unnamed uniform block",	false,	false,	glu::MATRIXORDER_ROW_MAJOR		},
		{ "unnamed_block_col_major",	"Unnamed uniform block",	false,	false,	glu::MATRIXORDER_COLUMN_MAJOR	},
	};

	const ResourceDefinition::Node::SharedPtr	program			(new ResourceDefinition::Program());
	const ResourceDefinition::Node::SharedPtr	shader			(new ResourceDefinition::Shader(program, glu::SHADERTYPE_COMPUTE, glslVersion));
	const ResourceDefinition::Node::SharedPtr	defaultBlock	(new ResourceDefinition::DefaultBlock(shader));
	const ResourceDefinition::Node::SharedPtr	buffer			(new ResourceDefinition::StorageQualifier(defaultBlock, glu::STORAGE_BUFFER));

	for (int childNdx = 0; childNdx < (int)DE_LENGTH_OF_ARRAY(children); ++childNdx)
	{
		ResourceDefinition::Node::SharedPtr	parentStructure	= buffer;
		tcu::TestCaseGroup* const			blockGroup		= new TestCaseGroup(context, children[childNdx].name, children[childNdx].description);

		targetGroup->addChild(blockGroup);

		if (children[childNdx].order != glu::MATRIXORDER_LAST)
		{
			glu::Layout layout;
			layout.matrixOrder = children[childNdx].order;
			parentStructure = ResourceDefinition::Node::SharedPtr(new ResourceDefinition::LayoutQualifier(parentStructure, layout));
		}

		parentStructure = ResourceDefinition::Node::SharedPtr(new ResourceDefinition::InterfaceBlock(parentStructure, children[childNdx].namedBlock));

		blockContentGenerator(context, parentStructure, blockGroup, children[childNdx].extendedBasicTypeCases);
	}
}